

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS
ref_collapse_edge_geometry(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_CELL pRVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  REF_BOOL geom_edge1;
  REF_BOOL geom_node1;
  REF_INT ncell;
  REF_INT degree1;
  REF_INT ids1 [3];
  REF_INT nodes [27];
  REF_INT cell_to_collapse [100];
  int local_260;
  int local_25c;
  int local_258;
  REF_INT local_254;
  REF_CELL local_250;
  int local_244;
  int local_240;
  REF_INT local_238 [3];
  int local_22c;
  int local_1c8;
  REF_INT local_1c4;
  
  pRVar1 = ref_grid->cell[0];
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  *allowed = 0;
  uVar3 = ref_geom_is_a(ref_geom,node1,0,&local_25c);
  if (uVar3 != 0) {
    pcVar7 = "node check";
    uVar5 = 0x187;
    goto LAB_001c6490;
  }
  if (local_25c != 0) {
LAB_001c64b9:
    *allowed = 0;
    return 0;
  }
  local_250 = pRVar1;
  uVar3 = ref_geom_is_a(ref_geom,node1,1,&local_260);
  if (uVar3 == 0) {
    if (local_260 != 0) {
      uVar3 = ref_cell_has_side(local_250,node0,node1,&local_1c8);
      if (uVar3 == 0) {
        if (local_1c8 == 0) {
          return 0;
        }
        goto switchD_001c65eb_caseD_0;
      }
      pcVar7 = "allowed if a side of a triangle";
      uVar5 = 0x192;
      goto LAB_001c6490;
    }
    uVar4 = ref_cell_id_list_around(ref_cell,node1,3,&local_254,&local_244);
    uVar3 = 0;
    if ((uVar4 != 0) && (uVar4 != 7)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
             0x19a,"ref_collapse_edge_geometry",(ulong)uVar4,"count faceids");
      uVar3 = uVar4;
    }
    if ((uVar4 != 7) && (uVar4 != 0)) {
      return uVar3;
    }
    uVar3 = 0;
    switch(local_254) {
    case 0:
switchD_001c65eb_caseD_0:
      *allowed = 1;
      return 0;
    case 1:
      uVar4 = ref_cell_has_side(ref_cell,node0,node1,allowed);
      uVar3 = 0;
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x1b2,"ref_collapse_edge_geometry",(ulong)uVar4,"allowed if a side of a triangle");
        uVar3 = uVar4;
      }
      break;
    case 2:
      uVar3 = ref_cell_list_with2(ref_cell,node0,node1,100,&local_258,&local_1c8);
      uVar6 = (ulong)uVar3;
      if (uVar3 == 0) {
        if (local_258 != 2) goto LAB_001c64b9;
        uVar3 = ref_cell_nodes(ref_cell,local_1c8,local_238);
        iVar2 = local_22c;
        if (uVar3 == 0) {
          uVar3 = ref_cell_nodes(ref_cell,local_1c4,local_238);
          if (uVar3 == 0) {
            if ((local_22c != local_240 || iVar2 != local_244) &&
               (iVar2 != local_240 || local_22c != local_244)) {
              return 0;
            }
            *allowed = 1;
            return 0;
          }
          uVar6 = (ulong)uVar3;
          pcVar7 = "nodes";
          uVar5 = 0x1aa;
        }
        else {
          uVar6 = (ulong)uVar3;
          pcVar7 = "nodes";
          uVar5 = 0x1a8;
        }
      }
      else {
        pcVar7 = "list";
        uVar5 = 0x1a3;
      }
      uVar3 = (uint)uVar6;
      goto LAB_001c6495;
    case 3:
      *allowed = 0;
      uVar3 = 0;
    }
  }
  else {
    pcVar7 = "edge check 1";
    uVar5 = 399;
LAB_001c6490:
    uVar6 = (ulong)uVar3;
LAB_001c6495:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar5,"ref_collapse_edge_geometry",uVar6,pcVar7);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_geometry(REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1,
                                              REF_BOOL *allowed) {
  REF_CELL ref_tri = ref_grid_tri(ref_grid);
  REF_CELL ref_edg = ref_grid_edg(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT degree1;
  REF_INT ids1[3];

  REF_INT ncell;
  REF_INT cell_to_collapse[MAX_CELL_COLLAPSE];
  REF_INT id0, id1;

  REF_BOOL geom_node1;
  REF_BOOL geom_edge1;
  REF_BOOL edge_side;

  *allowed = REF_FALSE;

  /* don't remove a geometry CAD node */
  RSS(ref_geom_is_a(ref_geom, node1, REF_GEOM_NODE, &geom_node1), "node check");
  if (geom_node1) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  /* geometry edge allowed if collapse is on edge */
  RSS(ref_geom_is_a(ref_geom, node1, REF_GEOM_EDGE, &geom_edge1),
      "edge check 1");
  if (geom_edge1) {
    RSS(ref_cell_has_side(ref_edg, node0, node1, &edge_side),
        "allowed if a side of a triangle");
    if (!edge_side) return REF_SUCCESS;
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  /* ids1 is a list of degree1 face ids for node1 */
  RXS(ref_cell_id_list_around(ref_tri, node1, 3, &degree1, ids1),
      REF_INCREASE_LIMIT, "count faceids");

  switch (degree1) {
    case 3: /* geometry node never allowed to move */
      *allowed = REF_FALSE;
      break;
    case 2: /* geometry edge allowed if collapse is on edge */
      RSS(ref_cell_list_with2(ref_tri, node0, node1, MAX_CELL_COLLAPSE, &ncell,
                              cell_to_collapse),
          "list");
      if (2 != ncell) {
        *allowed = REF_FALSE;
        break;
      }
      RSS(ref_cell_nodes(ref_tri, cell_to_collapse[0], nodes), "nodes");
      id0 = nodes[3];
      RSS(ref_cell_nodes(ref_tri, cell_to_collapse[1], nodes), "nodes");
      id1 = nodes[3];
      if ((id0 == ids1[0] && id1 == ids1[1]) ||
          (id1 == ids1[0] && id0 == ids1[1]))
        *allowed = REF_TRUE;
      break;
    case 1: /* geometry face allowed if on that face */
      RSS(ref_cell_has_side(ref_tri, node0, node1, allowed),
          "allowed if a side of a triangle");
      break;
    case 0: /* volume node always allowed */
      *allowed = REF_TRUE;
      break;
  }

  return REF_SUCCESS;
}